

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_att.cc
# Opt level: O2

X509_ATTRIBUTE *
X509_ATTRIBUTE_create_by_OBJ(X509_ATTRIBUTE **attr,ASN1_OBJECT *obj,int atrtype,void *data,int len)

{
  int iVar1;
  X509_ATTRIBUTE *attr_00;
  
  if (((attr != (X509_ATTRIBUTE **)0x0) && (attr_00 = *attr, attr_00 != (X509_ATTRIBUTE *)0x0)) ||
     (attr_00 = X509_ATTRIBUTE_new(), attr_00 != (X509_ATTRIBUTE *)0x0)) {
    iVar1 = X509_ATTRIBUTE_set1_object(attr_00,obj);
    if ((iVar1 != 0) && (iVar1 = X509_ATTRIBUTE_set1_data(attr_00,atrtype,data,len), iVar1 != 0)) {
      if (attr == (X509_ATTRIBUTE **)0x0) {
        return attr_00;
      }
      if (*attr != (X509_ATTRIBUTE *)0x0) {
        return attr_00;
      }
      *attr = attr_00;
      return attr_00;
    }
    if ((attr == (X509_ATTRIBUTE **)0x0) || (attr_00 != *attr)) {
      X509_ATTRIBUTE_free(attr_00);
    }
  }
  return (X509_ATTRIBUTE *)0x0;
}

Assistant:

X509_ATTRIBUTE *X509_ATTRIBUTE_create_by_OBJ(X509_ATTRIBUTE **attr,
                                             const ASN1_OBJECT *obj,
                                             int attrtype, const void *data,
                                             int len) {
  X509_ATTRIBUTE *ret;

  if ((attr == NULL) || (*attr == NULL)) {
    if ((ret = X509_ATTRIBUTE_new()) == NULL) {
      return NULL;
    }
  } else {
    ret = *attr;
  }

  if (!X509_ATTRIBUTE_set1_object(ret, obj)) {
    goto err;
  }
  if (!X509_ATTRIBUTE_set1_data(ret, attrtype, data, len)) {
    goto err;
  }

  if ((attr != NULL) && (*attr == NULL)) {
    *attr = ret;
  }
  return ret;
err:
  if ((attr == NULL) || (ret != *attr)) {
    X509_ATTRIBUTE_free(ret);
  }
  return NULL;
}